

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O3

void test_chunk(Chunk *ch)

{
  Chunk CVar1;
  FourCC FVar2;
  uint32_t uVar3;
  int iVar4;
  ostream *poVar5;
  bool no_chunk_id;
  bool bVar6;
  Chunk second;
  vector<char,_std::allocator<char>_> buffer;
  iterator first_it2;
  iterator first_it;
  Chunk first2;
  Chunk first;
  Chunk second2;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> subchunks_1;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> subchunks_2;
  string str1;
  string str3;
  string str2;
  Chunk local_170;
  vector<char,_std::allocator<char>_> local_168;
  Chunk local_148;
  Chunk local_140;
  size_t local_138;
  undefined1 local_130 [72];
  Chunk local_e8;
  Chunk local_e0;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> local_d8;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> local_c0;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> local_a8;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"hey this is a test","");
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"hey this is another test","")
  ;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"final test","");
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FVar2 = riffcpp::Chunk::id(ch);
  if (FVar2._M_elems == (_Type)0x46464952) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (",0x1d);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
    FVar2 = riffcpp::Chunk::type(ch);
    if (FVar2._M_elems == (_Type)0x6c706d73) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ch.type() == smpl_id (",0x16);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
      no_chunk_id = SUB81(ch,0);
      riffcpp::Chunk::begin(&local_e0,no_chunk_id);
      riffcpp::Chunk::end(&local_e8);
      std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
      vector<riffcpp::Chunk::iterator,void>
                ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&local_d8,
                 (iterator *)&local_e0,(iterator *)&local_e8,(allocator_type *)&local_140);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_e8);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_e0);
      if ((long)local_d8.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)local_d8.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl
                .super__Vector_impl_data._M_start == 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"chunks.size() == 2 (",0x14);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
        FVar2 = riffcpp::Chunk::id(local_d8.
                                   super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (FVar2._M_elems == (_Type)0x5453494c) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"chunks[0].id() == riffcpp::list_id (",0x24);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
          FVar2 = riffcpp::Chunk::type
                            (local_d8.
                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          if (FVar2._M_elems == (_Type)0x31747374) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"chunks[0].type() == tst1_id (",0x1d);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
            riffcpp::Chunk::begin
                      ((Chunk *)(local_130 + 0x40),
                       SUB81(local_d8.
                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                             _M_impl.super__Vector_impl_data._M_start,0));
            riffcpp::Chunk::end((Chunk *)(local_130 + 0x38));
            std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
            vector<riffcpp::Chunk::iterator,void>
                      ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&local_c0,
                       (iterator *)(local_130 + 0x40),(iterator *)(local_130 + 0x38),
                       (allocator_type *)&local_140);
            riffcpp::Chunk::iterator::~iterator((iterator *)(local_130 + 0x38));
            riffcpp::Chunk::iterator::~iterator((iterator *)(local_130 + 0x40));
            if ((long)local_c0.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_c0.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x10) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"subchunks_1.size() == 2 (",0x19);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
              FVar2 = riffcpp::Chunk::id(local_c0.
                                         super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              if (FVar2._M_elems == (_Type)0x74736574) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"subchunks_1[0].id() == test_id (",0x20);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
                uVar3 = riffcpp::Chunk::size
                                  (local_c0.
                                   super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                std::vector<char,_std::allocator<char>_>::resize(&local_168,(ulong)uVar3);
                riffcpp::Chunk::read_data
                          (local_c0.
                           super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                local_140.pimpl = (impl *)local_130;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_140,
                           local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                CVar1.pimpl = local_140.pimpl;
                if (local_138 == local_88) {
                  if (local_138 == 0) {
                    bVar6 = true;
                  }
                  else {
                    iVar4 = bcmp(local_140.pimpl,local_90,local_138);
                    bVar6 = iVar4 == 0;
                  }
                }
                else {
                  bVar6 = false;
                }
                if (CVar1.pimpl != (impl *)local_130) {
                  operator_delete(CVar1.pimpl,local_130._0_8_ + 1);
                }
                if (bVar6) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "std::string(buffer.data(), buffer.size()) == str1 (",0x33);
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
                  FVar2 = riffcpp::Chunk::id(local_c0.
                                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1);
                  if (FVar2._M_elems == (_Type)0x74736574) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"subchunks_1[1].id() == test_id (",0x20);
                    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x19);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
                    uVar3 = riffcpp::Chunk::size
                                      (local_c0.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1);
                    std::vector<char,_std::allocator<char>_>::resize(&local_168,(ulong)uVar3);
                    riffcpp::Chunk::read_data
                              (local_c0.
                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1,
                               local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,
                               (long)local_168.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_168.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
                    local_140.pimpl = (impl *)local_130;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_140,
                               local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,
                               local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish);
                    CVar1.pimpl = local_140.pimpl;
                    if (local_138 == local_48) {
                      if (local_138 == 0) {
                        bVar6 = true;
                      }
                      else {
                        iVar4 = bcmp(local_140.pimpl,local_50,local_138);
                        bVar6 = iVar4 == 0;
                      }
                    }
                    else {
                      bVar6 = false;
                    }
                    if (CVar1.pimpl != (impl *)local_130) {
                      operator_delete(CVar1.pimpl,local_130._0_8_ + 1);
                    }
                    if (bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "std::string(buffer.data(), buffer.size()) == str2 (",0x33);
                      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1d);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
                      FVar2 = riffcpp::Chunk::id(local_d8.
                                                 super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                      if (FVar2._M_elems == (_Type)0x74716573) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"chunks[1].id() == seqt_id (",0x1b);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1f);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
                        riffcpp::Chunk::begin
                                  ((Chunk *)(local_130 + 0x30),
                                   (bool)((char)local_d8.
                                                super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_1_ +
                                         '\b'));
                        riffcpp::Chunk::end((Chunk *)(local_130 + 0x28));
                        std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
                        vector<riffcpp::Chunk::iterator,void>
                                  ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)
                                   &local_a8,(iterator *)(local_130 + 0x30),
                                   (iterator *)(local_130 + 0x28),(allocator_type *)&local_140);
                        riffcpp::Chunk::iterator::~iterator((iterator *)(local_130 + 0x28));
                        riffcpp::Chunk::iterator::~iterator((iterator *)(local_130 + 0x30));
                        if ((long)local_a8.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_a8.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 8) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"subchunks_2.size() == 1 (",0x19);
                          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x22);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
                          FVar2 = riffcpp::Chunk::id(local_a8.
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          if (FVar2._M_elems == (_Type)0x74736574) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"subchunks_2[0].id() == test_id (",0x20
                                      );
                            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x23)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6);
                            uVar3 = riffcpp::Chunk::size
                                              (local_a8.
                                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                            std::vector<char,_std::allocator<char>_>::resize
                                      (&local_168,(ulong)uVar3);
                            riffcpp::Chunk::read_data
                                      (local_a8.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       local_168.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start,
                                       (long)local_168.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_finish -
                                       (long)local_168.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_start);
                            local_140.pimpl = (impl *)local_130;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_140,
                                       local_168.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start,
                                       local_168.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish);
                            CVar1.pimpl = local_140.pimpl;
                            if (local_138 == local_68) {
                              if (local_138 == 0) {
                                bVar6 = true;
                              }
                              else {
                                iVar4 = bcmp(local_140.pimpl,local_70,local_138);
                                bVar6 = iVar4 == 0;
                              }
                            }
                            else {
                              bVar6 = false;
                            }
                            if (CVar1.pimpl != (impl *)local_130) {
                              operator_delete(CVar1.pimpl,local_130._0_8_ + 1);
                            }
                            if (bVar6) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "std::string(buffer.data(), buffer.size()) == str3 (",0x33)
                              ;
                              poVar5 = (ostream *)
                                       std::ostream::operator<<((ostream *)&std::cout,0x27);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"): OK\n",6)
                              ;
                              riffcpp::Chunk::begin(&local_140,no_chunk_id);
                              riffcpp::Chunk::iterator::operator++
                                        ((iterator *)&local_170,(int)&local_140);
                              riffcpp::Chunk::iterator::operator*((iterator *)(local_130 + 0x18));
                              riffcpp::Chunk::iterator::~iterator((iterator *)&local_170);
                              riffcpp::Chunk::iterator::operator*((iterator *)&local_170);
                              FVar2 = riffcpp::Chunk::id((Chunk *)(local_130 + 0x18));
                              if (FVar2._M_elems == (_Type)0x5453494c) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"first.id() == riffcpp::list_id (",
                                           0x20);
                                poVar5 = (ostream *)
                                         std::ostream::operator<<((ostream *)&std::cout,0x2e);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar5,"): OK\n",6);
                                FVar2 = riffcpp::Chunk::type((Chunk *)(local_130 + 0x18));
                                if (FVar2._M_elems == (_Type)0x31747374) {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"first.type() == tst1_id (",0x19)
                                  ;
                                  poVar5 = (ostream *)
                                           std::ostream::operator<<((ostream *)&std::cout,0x2f);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar5,"): OK\n",6);
                                  FVar2 = riffcpp::Chunk::id(&local_170);
                                  if (FVar2._M_elems == (_Type)0x74716573) {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"second.id() == seqt_id (",0x18
                                              );
                                    poVar5 = (ostream *)
                                             std::ostream::operator<<((ostream *)&std::cout,0x30);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar5,"): OK\n",6);
                                    riffcpp::Chunk::begin(&local_148,no_chunk_id);
                                    riffcpp::Chunk::iterator::operator*
                                              ((iterator *)(local_130 + 0x10));
                                    riffcpp::Chunk::iterator::operator++((iterator *)&local_148);
                                    riffcpp::Chunk::iterator::operator*
                                              ((iterator *)(local_130 + 0x20));
                                    FVar2 = riffcpp::Chunk::id((Chunk *)(local_130 + 0x10));
                                    if (FVar2._M_elems == (_Type)0x5453494c) {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "first2.id() == riffcpp::list_id (",0x21);
                                      poVar5 = (ostream *)
                                               std::ostream::operator<<((ostream *)&std::cout,0x37);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar5,"): OK\n",6);
                                      FVar2 = riffcpp::Chunk::type((Chunk *)(local_130 + 0x10));
                                      if (FVar2._M_elems == (_Type)0x31747374) {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                   "first2.type() == tst1_id (",0x1a);
                                        poVar5 = (ostream *)
                                                 std::ostream::operator<<
                                                           ((ostream *)&std::cout,0x38);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar5,"): OK\n",6);
                                        FVar2 = riffcpp::Chunk::id((Chunk *)(local_130 + 0x20));
                                        if (FVar2._M_elems == (_Type)0x74716573) {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                     "second2.id() == seqt_id (",0x19);
                                          poVar5 = (ostream *)
                                                   std::ostream::operator<<
                                                             ((ostream *)&std::cout,0x39);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar5,"): OK\n",6);
                                          riffcpp::Chunk::~Chunk((Chunk *)(local_130 + 0x20));
                                          riffcpp::Chunk::~Chunk((Chunk *)(local_130 + 0x10));
                                          riffcpp::Chunk::iterator::~iterator
                                                    ((iterator *)&local_148);
                                          riffcpp::Chunk::~Chunk(&local_170);
                                          riffcpp::Chunk::~Chunk((Chunk *)(local_130 + 0x18));
                                          riffcpp::Chunk::iterator::~iterator
                                                    ((iterator *)&local_140);
                                          std::
                                          vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::
                                          ~vector(&local_a8);
                                          std::
                                          vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::
                                          ~vector(&local_c0);
                                          std::
                                          vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::
                                          ~vector(&local_d8);
                                          if (local_168.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start !=
                                              (char *)0x0) {
                                            operator_delete(local_168.
                                                                                                                        
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.
                                                                                                                
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.
                                                                                                                    
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                                          }
                                          if (local_70 != local_60) {
                                            operator_delete(local_70,local_60[0] + 1);
                                          }
                                          if (local_50 != local_40) {
                                            operator_delete(local_50,local_40[0] + 1);
                                          }
                                          if (local_90 != local_80) {
                                            operator_delete(local_90,local_80[0] + 1);
                                          }
                                          return;
                                        }
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cerr,"Assertion failed on line "
                                                   ,0x19);
                                        poVar5 = (ostream *)
                                                 std::ostream::operator<<
                                                           ((ostream *)&std::cerr,0x39);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar5,": second2.id() == seqt_id\n",0x1a);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar5,"Reason: ",8);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar5,"Subchunk must have \'seqt\' id",0x1c);
                                        std::operator<<(poVar5,'\n');
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cerr,"Assertion failed on line "
                                                   ,0x19);
                                        poVar5 = (ostream *)
                                                 std::ostream::operator<<
                                                           ((ostream *)&std::cerr,0x38);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar5,": first2.type() == tst1_id\n",0x1b);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar5,"Reason: ",8);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar5,"Subchunk must have \'LIST\' id",0x1c);
                                        std::operator<<(poVar5,'\n');
                                      }
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cerr,"Assertion failed on line ",
                                                 0x19);
                                      poVar5 = (ostream *)
                                               std::ostream::operator<<((ostream *)&std::cerr,0x37);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar5,": first2.id() == riffcpp::list_id\n",0x22);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar5,"Reason: ",8);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar5,"Subchunk must have \'LIST\' id",0x1c);
                                      std::operator<<(poVar5,'\n');
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cerr,"Assertion failed on line ",
                                               0x19);
                                    poVar5 = (ostream *)
                                             std::ostream::operator<<((ostream *)&std::cerr,0x30);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar5,": second.id() == seqt_id\n",0x19);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar5,"Reason: ",8);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar5,"Subchunk must have \'seqt\' id",0x1c);
                                    std::operator<<(poVar5,'\n');
                                  }
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,"Assertion failed on line ",0x19)
                                  ;
                                  poVar5 = (ostream *)
                                           std::ostream::operator<<((ostream *)&std::cerr,0x2f);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar5,": first.type() == tst1_id\n",0x1a);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar5,"Reason: ",8);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar5,"Subchunk must have \'LIST\' id",0x1c);
                                  std::operator<<(poVar5,'\n');
                                }
                              }
                              else {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                                poVar5 = (ostream *)
                                         std::ostream::operator<<((ostream *)&std::cerr,0x2e);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar5,": first.id() == riffcpp::list_id\n",0x21);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar5,"Reason: ",8);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar5,"Subchunk must have \'LIST\' id",0x1c);
                                std::operator<<(poVar5,'\n');
                              }
                            }
                            else {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                              poVar5 = (ostream *)
                                       std::ostream::operator<<((ostream *)&std::cerr,0x27);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar5,
                                         ": std::string(buffer.data(), buffer.size()) == str3\n",
                                         0x34);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar5,"Reason: ",8);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar5,"Strings must be equal",0x15);
                              std::operator<<(poVar5,'\n');
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x23)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar5,": subchunks_2[0].id() == test_id\n",0x21);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar5,"Subchunk must have \'test\' id",0x1c);
                            std::operator<<(poVar5,'\n');
                          }
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x22);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar5,": subchunks_2.size() == 1\n",0x1a);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar5,"Subchunk must have one subchunk",0x1f);
                          std::operator<<(poVar5,'\n');
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5,": chunks[1].id() == seqt_id\n",0x1c);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar5,"Subchunk must have \'seqt\' id",0x1c);
                        std::operator<<(poVar5,'\n');
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1d);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar5,": std::string(buffer.data(), buffer.size()) == str2\n",0x34
                                );
                      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar5,"Strings must be equal",0x15);
                      std::operator<<(poVar5,'\n');
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x19);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,": subchunks_1[1].id() == test_id\n",0x21);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,"Subchunk must have \'test\' id",0x1c);
                    std::operator<<(poVar5,'\n');
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x18);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5,": std::string(buffer.data(), buffer.size()) == str1\n",0x34);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5,"Strings must be equal",0x15);
                  std::operator<<(poVar5,'\n');
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x14);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,": subchunks_1[0].id() == test_id\n",0x21);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,"Subchunk must have \'test\' id",0x1c);
                std::operator<<(poVar5,'\n');
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,": subchunks_1.size() == 2\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"Subchunk must have two subchunks",0x20);
              std::operator<<(poVar5,'\n');
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,": chunks[0].type() == tst1_id\n",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"Subchunk must have \'tst1\' type",0x1e);
            std::operator<<(poVar5,'\n');
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,": chunks[0].id() == riffcpp::list_id\n",0x25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Subchunk must have \'LIST\' id",0x1c);
          std::operator<<(poVar5,'\n');
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": chunks.size() == 2\n",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"Toplevel chunk must contain two subchunks",0x29);
        std::operator<<(poVar5,'\n');
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ch.type() == smpl_id\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected \'smpl\' chunk",0x15);
      std::operator<<(poVar5,'\n');
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Assertion failed on line ",0x19);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,": ch.id() == riffcpp::riff_id\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Reason: ",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Toplevel \'RIFF\' id expected",0x1b);
    std::operator<<(poVar5,'\n');
  }
  exit(1);
}

Assistant:

void test_chunk(riffcpp::Chunk &ch) {
  std::string str1("hey this is a test"), str2("hey this is another test"),
   str3("final test");

  std::vector<char> buffer;

  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks{ch.begin(), ch.end()};
  TEST_ASSERT(chunks.size() == 2, "Toplevel chunk must contain two subchunks");

  TEST_ASSERT(chunks[0].id() == riffcpp::list_id,
              "Subchunk must have 'LIST' id");
  TEST_ASSERT(chunks[0].type() == tst1_id, "Subchunk must have 'tst1' type");
  std::vector<riffcpp::Chunk> subchunks_1{chunks[0].begin(), chunks[0].end()};
  TEST_ASSERT(subchunks_1.size() == 2, "Subchunk must have two subchunks");
  TEST_ASSERT(subchunks_1[0].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_1[0].size());
  subchunks_1[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str1,
              "Strings must be equal");
  TEST_ASSERT(subchunks_1[1].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_1[1].size());
  subchunks_1[1].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str2,
              "Strings must be equal");

  TEST_ASSERT(chunks[1].id() == seqt_id, "Subchunk must have 'seqt' id");
  std::vector<riffcpp::Chunk> subchunks_2{chunks[1].begin(true),
                                          chunks[1].end()};
  TEST_ASSERT(subchunks_2.size() == 1, "Subchunk must have one subchunk");
  TEST_ASSERT(subchunks_2[0].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_2[0].size());
  subchunks_2[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str3,
              "Strings must be equal");

  // Test prefix and postfix increment operators
  auto first_it = ch.begin();
  auto first = *(first_it++);
  auto second = *first_it;

  TEST_ASSERT(first.id() == riffcpp::list_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(first.type() == tst1_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(second.id() == seqt_id, "Subchunk must have 'seqt' id");

  auto first_it2 = ch.begin();
  auto first2 = *first_it2;
  ++first_it2;
  auto second2 = *first_it2;

  TEST_ASSERT(first2.id() == riffcpp::list_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(first2.type() == tst1_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(second2.id() == seqt_id, "Subchunk must have 'seqt' id");
}